

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

lu_int basiclu_obj_solve_for_update
                 (basiclu_object *obj,lu_int nzrhs,lu_int *irhs,double *xrhs,char trans,
                 lu_int want_solution)

{
  lu_int lVar1;
  basiclu_object *in_RDI;
  int in_R9D;
  lu_int status;
  double *in_stack_000001d0;
  lu_int *in_stack_000001d8;
  double *in_stack_000001e0;
  lu_int *in_stack_000001e8;
  double *in_stack_000001f0;
  lu_int *in_stack_000001f8;
  lu_int *in_stack_00000210;
  double *in_stack_00000218;
  lu_int in_stack_00000220;
  lu_int *in_stack_00000228;
  double *in_stack_00000230;
  lu_int *in_stack_00000238;
  lu_int *in_stack_00000240;
  double *in_stack_00000248;
  char in_stack_00000250;
  basiclu_object *in_stack_ffffffffffffff00;
  basiclu_object *local_c0;
  int local_5c;
  lu_int local_2c;
  
  local_5c = 0;
  lVar1 = isvalid(in_RDI);
  if (lVar1 == 0) {
    local_2c = -8;
  }
  else {
    lu_clear_lhs(in_stack_ffffffffffffff00);
    while (local_5c == 0) {
      if (in_R9D == 0) {
        local_c0 = (basiclu_object *)0x0;
      }
      else {
        local_c0 = (basiclu_object *)&in_RDI->nzlhs;
      }
      local_5c = basiclu_solve_for_update
                           (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                            in_stack_000001d8,in_stack_000001d0,in_stack_00000210,in_stack_00000218,
                            in_stack_00000220,in_stack_00000228,in_stack_00000230,in_stack_00000238,
                            in_stack_00000240,in_stack_00000248,in_stack_00000250);
      if (local_5c != 1) break;
      local_5c = lu_realloc_obj(local_c0);
    }
    local_2c = local_5c;
  }
  return local_2c;
}

Assistant:

lu_int basiclu_obj_solve_for_update(struct basiclu_object *obj, lu_int nzrhs,
                                    const lu_int irhs[], const double xrhs[],
                                    char trans, lu_int want_solution)
{
    lu_int status = BASICLU_OK;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    lu_clear_lhs(obj);
    while (status == BASICLU_OK)
    {
        status = basiclu_solve_for_update(obj->istore, obj->xstore, obj->Li,
                                          obj->Lx, obj->Ui, obj->Ux, obj->Wi,
                                          obj->Wx, nzrhs, irhs, xrhs,
                                          want_solution ? &obj->nzlhs : NULL,
                                          obj->ilhs, obj->lhs, trans);
        if (status != BASICLU_REALLOCATE)
            break;
        status = lu_realloc_obj(obj);
    }

    return status;
}